

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

void garray_rename(_garray *x,t_symbol *s)

{
  if ((x->field_0x30 & 8) != 0) {
    garray_arrayviewlist_close(x);
  }
  pd_unbind((t_pd *)x,x->x_realname);
  x->x_name = s;
  x->x_realname = s;
  pd_bind((t_pd *)x,s);
  garray_redraw(x);
  return;
}

Assistant:

static void garray_rename(t_garray *x, t_symbol *s)
{
    /* jsarlo { */
    if (x->x_listviewing)
    {
        garray_arrayviewlist_close(x);
    }
    /* } jsarlo */
    pd_unbind(&x->x_gobj.g_pd, x->x_realname);
    pd_bind(&x->x_gobj.g_pd, x->x_realname = x->x_name = s);
    garray_redraw(x);
}